

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_QFileSystemListView.cpp
# Opt level: O1

void QFileSystemListView::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  QStringList *nameFilters;
  Section *pSVar1;
  undefined4 *puVar2;
  code *pcVar3;
  long lVar4;
  undefined8 uVar5;
  Data *pDVar6;
  QString *pQVar7;
  qsizetype qVar8;
  bool bVar9;
  Filters FVar10;
  int iVar11;
  QArrayDataPointer<QString> local_48;
  void *local_30;
  QArrayDataPointer<QString> local_28;
  
  switch(_c) {
  case InvokeMetaMethod:
    if (_id == 2) {
      local_48.ptr = (QString *)_a[1];
      iVar11 = 2;
    }
    else if (_id == 1) {
      local_30 = _a[3];
      local_48.ptr = (QString *)_a[1];
      local_48.size = (qsizetype)_a[2];
      iVar11 = 1;
    }
    else {
      if (_id != 0) {
        return;
      }
      local_48.ptr = (QString *)_a[1];
      iVar11 = 0;
    }
    local_48.d = (Data *)0x0;
    QMetaObject::activate(_o,&staticMetaObject,iVar11,&local_48.d);
    break;
  case ReadProperty:
    if (7 < (uint)_id) {
      return;
    }
    pSVar1 = (Section *)*_a;
    switch(_id) {
    case 0:
      bVar9 = nameFilterDisables((QFileSystemListView *)_o);
      break;
    case 1:
      bVar9 = readOnly((QFileSystemListView *)_o);
      break;
    case 2:
      bVar9 = resolveSymlinks((QFileSystemListView *)_o);
      break;
    case 3:
      bVar9 = browsable((QFileSystemListView *)_o);
      break;
    case 4:
      FVar10 = filters((QFileSystemListView *)_o);
      goto LAB_001695f5;
    case 5:
      QFileSystemListView::nameFilters((QStringList *)&local_28,(QFileSystemListView *)_o);
      qVar8 = local_28.size;
      pQVar7 = local_28.ptr;
      pDVar6 = local_28.d;
      local_28.d = (Data *)0x0;
      local_28.ptr = (QString *)0x0;
      local_28.size = 0;
      local_48.d = *(Data **)pSVar1;
      local_48.ptr = *(QString **)(pSVar1 + 2);
      *(Data **)pSVar1 = pDVar6;
      *(QString **)(pSVar1 + 2) = pQVar7;
      local_48.size = *(qsizetype *)(pSVar1 + 4);
      *(qsizetype *)(pSVar1 + 4) = qVar8;
      QArrayDataPointer<QString>::~QArrayDataPointer(&local_48);
      QArrayDataPointer<QString>::~QArrayDataPointer(&local_28);
      return;
    case 6:
      FVar10.i = visibleSection((QFileSystemListView *)_o);
LAB_001695f5:
      *pSVar1 = FVar10.i;
      return;
    case 7:
      rootPath((QString *)&local_48,(QFileSystemListView *)_o);
      pDVar6 = *(Data **)pSVar1;
      pQVar7 = *(QString **)(pSVar1 + 2);
      *(Data **)pSVar1 = local_48.d;
      *(QString **)(pSVar1 + 2) = local_48.ptr;
      uVar5 = *(undefined8 *)(pSVar1 + 4);
      *(qsizetype *)(pSVar1 + 4) = local_48.size;
      local_48.d = pDVar6;
      local_48.ptr = pQVar7;
      local_48.size = uVar5;
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_48);
      return;
    }
    *(bool *)pSVar1 = bVar9;
    break;
  case WriteProperty:
    if ((uint)_id < 8) {
      nameFilters = (QStringList *)*_a;
      switch(_id) {
      case 0:
        setNameFilterDisables((QFileSystemListView *)_o,*(bool *)&(nameFilters->d).d);
        return;
      case 1:
        setReadOnly((QFileSystemListView *)_o,*(bool *)&(nameFilters->d).d);
        return;
      case 2:
        setResolveSymlinks((QFileSystemListView *)_o,*(bool *)&(nameFilters->d).d);
        return;
      case 3:
        setBrowsable((QFileSystemListView *)_o,*(bool *)&(nameFilters->d).d);
        return;
      case 4:
        setFilters((QFileSystemListView *)_o,(Filters)*(Int *)&(nameFilters->d).d);
        return;
      case 5:
        setNameFilters((QFileSystemListView *)_o,nameFilters);
        return;
      case 6:
        setVisibleSection((QFileSystemListView *)_o,*(Section *)&(nameFilters->d).d);
        return;
      case 7:
        setRootPath((QFileSystemListView *)_o,(QString *)nameFilters);
        return;
      }
    }
    break;
  case IndexOfMethod:
    puVar2 = (undefined4 *)*_a;
    pcVar3 = *_a[1];
    lVar4 = *(long *)((long)_a[1] + 8);
    if (pcVar3 == directoryLoaded && lVar4 == 0) {
      *puVar2 = 0;
    }
    else if (pcVar3 == fileRenamed && lVar4 == 0) {
      *puVar2 = 1;
    }
    else if (pcVar3 == rootPathChanged && lVar4 == 0) {
      *puVar2 = 2;
    }
  }
  return;
}

Assistant:

void QFileSystemListView::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    if (_c == QMetaObject::InvokeMetaMethod) {
        auto *_t = static_cast<QFileSystemListView *>(_o);
        (void)_t;
        switch (_id) {
        case 0: _t->directoryLoaded((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 1: _t->fileRenamed((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QString>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<QString>>(_a[3]))); break;
        case 2: _t->rootPathChanged((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        default: ;
        }
    } else if (_c == QMetaObject::IndexOfMethod) {
        int *result = reinterpret_cast<int *>(_a[0]);
        {
            using _t = void (QFileSystemListView::*)(const QString & );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&QFileSystemListView::directoryLoaded)) {
                *result = 0;
                return;
            }
        }
        {
            using _t = void (QFileSystemListView::*)(const QString & , const QString & , const QString & );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&QFileSystemListView::fileRenamed)) {
                *result = 1;
                return;
            }
        }
        {
            using _t = void (QFileSystemListView::*)(const QString & );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&QFileSystemListView::rootPathChanged)) {
                *result = 2;
                return;
            }
        }
    }
#ifndef QT_NO_PROPERTIES
    else if (_c == QMetaObject::ReadProperty) {
        auto *_t = static_cast<QFileSystemListView *>(_o);
        (void)_t;
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast< bool*>(_v) = _t->nameFilterDisables(); break;
        case 1: *reinterpret_cast< bool*>(_v) = _t->readOnly(); break;
        case 2: *reinterpret_cast< bool*>(_v) = _t->resolveSymlinks(); break;
        case 3: *reinterpret_cast< bool*>(_v) = _t->browsable(); break;
        case 4: *reinterpret_cast< QDir::Filters*>(_v) = _t->filters(); break;
        case 5: *reinterpret_cast< QStringList*>(_v) = _t->nameFilters(); break;
        case 6: *reinterpret_cast< QFileSystemListView::Section*>(_v) = _t->visibleSection(); break;
        case 7: *reinterpret_cast< QString*>(_v) = _t->rootPath(); break;
        default: break;
        }
    } else if (_c == QMetaObject::WriteProperty) {
        auto *_t = static_cast<QFileSystemListView *>(_o);
        (void)_t;
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setNameFilterDisables(*reinterpret_cast< bool*>(_v)); break;
        case 1: _t->setReadOnly(*reinterpret_cast< bool*>(_v)); break;
        case 2: _t->setResolveSymlinks(*reinterpret_cast< bool*>(_v)); break;
        case 3: _t->setBrowsable(*reinterpret_cast< bool*>(_v)); break;
        case 4: _t->setFilters(*reinterpret_cast< QDir::Filters*>(_v)); break;
        case 5: _t->setNameFilters(*reinterpret_cast< QStringList*>(_v)); break;
        case 6: _t->setVisibleSection(*reinterpret_cast< QFileSystemListView::Section*>(_v)); break;
        case 7: _t->setRootPath(*reinterpret_cast< QString*>(_v)); break;
        default: break;
        }
    } else if (_c == QMetaObject::ResetProperty) {
    } else if (_c == QMetaObject::BindableProperty) {
    }
#endif // QT_NO_PROPERTIES
}